

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O3

bool __thiscall
glcts::anon_unknown_0::CPrimitiveMode::
IsGeometryShaderSupported<glcts::(anonymous_namespace)::test_api::ES3>(CPrimitiveMode *this)

{
  Context *pCVar1;
  ContextInfo *this_00;
  bool bVar2;
  ContextType ctxType;
  string local_40;
  
  pCVar1 = (this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.m_context;
  this_00 = pCVar1->m_contextInfo;
  ctxType.super_ApiType.m_bits = (ApiType)(*pCVar1->m_renderCtx->_vptr_RenderContext[2])();
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (bVar2) {
    return true;
  }
  bVar2 = glu::contextSupports(ctxType,(ApiType)0x13);
  if (bVar2) {
    bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_geometry_shader");
    if (bVar2) {
      return true;
    }
    bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_OES_geometry_shader");
    if (bVar2) {
      return true;
    }
  }
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Geometry shader is not supported\n","");
  deqp::SubcaseBase::OutputNotSupported((SubcaseBase *)this,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return false;
}

Assistant:

bool IsGeometryShaderSupported()
	{
		if (api::isES())
		{
			const glu::ContextInfo& info = m_context.getContextInfo();
			const glu::ContextType& type = m_context.getRenderContext().getType();

			/* ES 3.2+ included geometry shaders into the core */
			if (glu::contextSupports(type, glu::ApiType(3, 2, glu::PROFILE_ES)))
			{
				return true;
			}
			/* ES 3.1 may be able to support geometry shaders via extensions */
			else if ((glu::contextSupports(type, glu::ApiType(3, 1, glu::PROFILE_ES))) &&
					 ((true == info.isExtensionSupported("GL_EXT_geometry_shader")) ||
					  (true == info.isExtensionSupported("GL_OES_geometry_shader"))))
			{
				return true;
			}
			else
			{
				OutputNotSupported("Geometry shader is not supported\n");
				return false;
			}
		}
		else
		{
			return true;
		}
	}